

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O1

void __thiscall
mbc::Val::VecStr::VecStr
          (VecStr *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *vaild_checker)

{
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  string local_40;
  
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__VecStr_001409f8;
  pvVar2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  (pvVar2->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->value_ = pvVar2;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=((this->super__ValAtom).vaild_checker_,vaild_checker);
  psVar1 = (this->super__ValAtom).super_ValBase.invaild_waring_;
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)psVar1->_M_string_length,0x1322da);
  *(this->super__ValAtom).super_ValBase.type_ = VECSTR;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"[]","");
  _ValAtom::set(&this->super__ValAtom,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

VecStr::VecStr(std::function<bool(const std::string&)> vaild_checker) : _ValAtom() {
    value_          = new vector<string>();

    *vaild_checker_  = vaild_checker;
    *invaild_waring_ = "[invaild vecstr]";
    *type_           = Type(VECSTR);

    set("[]");
}